

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_element_conflict ply_find_element(p_ply ply,char *name)

{
  p_ply_element_conflict ptVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int nelements;
  int i;
  p_ply_element_conflict element;
  char *name_local;
  p_ply ply_local;
  
  if ((ply == (p_ply)0x0) || (name == (char *)0x0)) {
    __assert_fail("ply && name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x39b,"p_ply_element ply_find_element(p_ply, const char *)");
  }
  ptVar1 = ply->element;
  iVar2 = (int)ply->nelements;
  if ((ptVar1 == (p_ply_element_conflict)0x0) && (iVar2 != 0)) {
    __assert_fail("element || nelements == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x39e,"p_ply_element ply_find_element(p_ply, const char *)");
  }
  if ((ptVar1 != (p_ply_element_conflict)0x0) && (iVar2 < 1)) {
    __assert_fail("!element || nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x39f,"p_ply_element ply_find_element(p_ply, const char *)");
  }
  local_2c = 0;
  while( true ) {
    if (iVar2 <= local_2c) {
      return (p_ply_element_conflict)0x0;
    }
    iVar3 = strcmp(ptVar1[local_2c].name,name);
    if (iVar3 == 0) break;
    local_2c = local_2c + 1;
  }
  return ptVar1 + local_2c;
}

Assistant:

static p_ply_element ply_find_element(p_ply ply, const char *name) {
    p_ply_element element;
    int i, nelements;
    assert(ply && name);
    element = ply->element;
    nelements = ply->nelements;
    assert(element || nelements == 0);
    assert(!element || nelements > 0);
    for (i = 0; i < nelements; i++)
        if (!strcmp(element[i].name, name)) return &element[i];
    return NULL;
}